

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O3

ts_nsec ts_diff(ts_nsec start,ts_nsec end)

{
  long lVar1;
  long lVar2;
  
  lVar2 = end - start;
  lVar1 = lVar2 + 1000000000;
  if (-1 < lVar2) {
    lVar1 = lVar2;
  }
  return lVar1 / 1000;
}

Assistant:

ts_nsec ts_diff(ts_nsec start, ts_nsec end)
{
    ts_nsec diff = 0;
    if ((end-start)<0) {
        diff  = 1000000000+end-start;
    } else {
        diff = end-start;
    }
    return diff/1000;
}